

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O0

QIcon __thiscall QFileIconProvider::icon(QFileIconProvider *this,IconType type)

{
  StandardPixmap in_EDX;
  QFileIconProviderPrivate *in_RSI;
  QIconPrivate *in_RDI;
  QFileIconProviderPrivate *d;
  
  d_func((QFileIconProvider *)0x2c748c);
  switch(in_EDX) {
  case SP_TitleBarMenuButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  case SP_TitleBarMinButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  case SP_TitleBarMaxButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  case SP_TitleBarCloseButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  case SP_TitleBarNormalButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  case SP_TitleBarShadeButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  case SP_TitleBarUnshadeButton:
    QFileIconProviderPrivate::getIcon(in_RSI,in_EDX);
    break;
  default:
    QIcon::QIcon((QIcon *)in_RDI);
  }
  return (QIcon)in_RDI;
}

Assistant:

QIcon QFileIconProvider::icon(IconType type) const
{
    Q_D(const QFileIconProvider);
    switch (type) {
    case Computer:
        return d->getIcon(QStyle::SP_ComputerIcon);
    case Desktop:
        return d->getIcon(QStyle::SP_DesktopIcon);
    case Trashcan:
        return d->getIcon(QStyle::SP_TrashIcon);
    case Network:
        return d->getIcon(QStyle::SP_DriveNetIcon);
    case Drive:
        return d->getIcon(QStyle::SP_DriveHDIcon);
    case Folder:
        return d->getIcon(QStyle::SP_DirIcon);
    case File:
        return d->getIcon(QStyle::SP_FileIcon);
    default:
        break;
    };
    return QIcon();
}